

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeNumber(ExpressionContext *ctx,SynNumber *syntax)

{
  char *pcVar1;
  SynNumber *pSVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  InplaceStr *pIVar6;
  ExpressionContext *pEVar7;
  double dVar8;
  double num;
  double num_6;
  unsigned_long_long local_a8;
  longlong num_2;
  longlong num_5;
  unsigned_long_long uStack_90;
  uint pos_2;
  unsigned_long_long num_4;
  unsigned_long_long local_78;
  longlong num_3;
  undefined1 local_68 [4];
  uint pos_1;
  uint local_58;
  byte local_51;
  uint i;
  bool isFP;
  longlong num_1;
  undefined1 local_40 [4];
  uint pos;
  byte local_29;
  InplaceStr *pIStack_28;
  bool forceLong;
  InplaceStr *value;
  SynNumber *syntax_local;
  ExpressionContext *ctx_local;
  
  pIStack_28 = &syntax->value;
  value = (InplaceStr *)syntax;
  syntax_local = (SynNumber *)ctx;
  uVar4 = InplaceStr::length(pIStack_28);
  if ((uVar4 < 2) || (pIStack_28->begin[1] != 'x')) {
    local_51 = 0;
    for (local_58 = 0; uVar4 = local_58, uVar5 = InplaceStr::length(pIStack_28), uVar4 < uVar5;
        local_58 = local_58 + 1) {
      if ((pIStack_28->begin[local_58] == '.') || (pIStack_28->begin[local_58] == 'e')) {
        local_51 = 1;
      }
    }
    if ((local_51 & 1) == 0) {
      pIVar6 = value + 5;
      InplaceStr::InplaceStr((InplaceStr *)local_68,"b");
      bVar3 = InplaceStr::operator==(pIVar6,(InplaceStr *)local_68);
      if (bVar3) {
        for (num_3._4_4_ = 0; pIStack_28->begin[num_3._4_4_] == '0'; num_3._4_4_ = num_3._4_4_ + 1)
        {
        }
        uVar4 = InplaceStr::length(pIStack_28);
        if (0x40 < (int)(uVar4 - num_3._4_4_)) {
          anon_unknown.dwarf_8df1c::ReportAt
                    ((ExpressionContext *)syntax_local,(SynBase *)value,pIStack_28->begin,
                     "ERROR: overflow in binary constant");
        }
        local_78 = anon_unknown.dwarf_8df1c::ParseLong
                             ((ExpressionContext *)syntax_local,(SynBase *)value,
                              pIStack_28->begin + num_3._4_4_,pIStack_28->end,2);
        if ((long)(int)local_78 == local_78) {
          pEVar7 = (ExpressionContext *)
                   ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)syntax_local);
          ExprIntegerLiteral::ExprIntegerLiteral
                    ((ExprIntegerLiteral *)pEVar7,(SynBase *)value,
                     *(TypeBase **)&syntax_local[0x16f].super_SynBase.listed,local_78);
          ctx_local = pEVar7;
        }
        else {
          pEVar7 = (ExpressionContext *)
                   ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)syntax_local);
          ExprIntegerLiteral::ExprIntegerLiteral
                    ((ExprIntegerLiteral *)pEVar7,(SynBase *)value,
                     (TypeBase *)syntax_local[0x16f].value.begin,local_78);
          ctx_local = pEVar7;
        }
      }
      else {
        pIVar6 = value + 5;
        InplaceStr::InplaceStr((InplaceStr *)&num_4,"l");
        bVar3 = InplaceStr::operator==(pIVar6,(InplaceStr *)&num_4);
        if (bVar3) {
          uStack_90 = anon_unknown.dwarf_8df1c::ParseLong
                                ((ExpressionContext *)syntax_local,(SynBase *)value,
                                 pIStack_28->begin,pIStack_28->end,10);
          if (0x7fffffffffffffff < uStack_90) {
            anon_unknown.dwarf_8df1c::StopAt
                      ((ExpressionContext *)syntax_local,(SynBase *)value,pIStack_28->begin,
                       "ERROR: overflow in integer constant");
          }
          pEVar7 = (ExpressionContext *)
                   ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)syntax_local);
          ExprIntegerLiteral::ExprIntegerLiteral
                    ((ExprIntegerLiteral *)pEVar7,(SynBase *)value,
                     (TypeBase *)syntax_local[0x16f].value.begin,uStack_90);
          ctx_local = pEVar7;
        }
        else {
          bVar3 = InplaceStr::empty(value + 5);
          pSVar2 = syntax_local;
          pIVar6 = value;
          if (!bVar3) {
            pcVar1 = value[5].begin;
            uVar4 = InplaceStr::length(value + 5);
            anon_unknown.dwarf_8df1c::ReportAt
                      ((ExpressionContext *)pSVar2,(SynBase *)pIVar6,pcVar1,
                       "ERROR: unknown number suffix \'%.*s\'",(ulong)uVar4,value[5].begin);
          }
          uVar4 = InplaceStr::length(pIStack_28);
          if (((uVar4 < 2) || (*pIStack_28->begin != '0')) ||
             (bVar3 = isDigit(pIStack_28->begin[1]), !bVar3)) {
            local_a8 = anon_unknown.dwarf_8df1c::ParseLong
                                 ((ExpressionContext *)syntax_local,(SynBase *)value,
                                  pIStack_28->begin,pIStack_28->end,10);
            if ((long)(int)local_a8 != local_a8) {
              anon_unknown.dwarf_8df1c::StopAt
                        ((ExpressionContext *)syntax_local,(SynBase *)value,pIStack_28->begin,
                         "ERROR: overflow in integer constant");
            }
            pEVar7 = (ExpressionContext *)
                     ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)syntax_local);
            ExprIntegerLiteral::ExprIntegerLiteral
                      ((ExprIntegerLiteral *)pEVar7,(SynBase *)value,
                       *(TypeBase **)&syntax_local[0x16f].super_SynBase.listed,local_a8);
            ctx_local = pEVar7;
          }
          else {
            for (num_5._4_4_ = 0; pIStack_28->begin[num_5._4_4_] == '0';
                num_5._4_4_ = num_5._4_4_ + 1) {
            }
            uVar4 = InplaceStr::length(pIStack_28);
            if ((0x16 < (int)(uVar4 - num_5._4_4_)) ||
               ((uVar4 = InplaceStr::length(pIStack_28), 0x15 < (int)(uVar4 - num_5._4_4_) &&
                (pIStack_28->begin[num_5._4_4_] != '1')))) {
              anon_unknown.dwarf_8df1c::ReportAt
                        ((ExpressionContext *)syntax_local,(SynBase *)value,pIStack_28->begin,
                         "ERROR: overflow in octal constant");
            }
            num_2 = anon_unknown.dwarf_8df1c::ParseLong
                              ((ExpressionContext *)syntax_local,(SynBase *)value,pIStack_28->begin,
                               pIStack_28->end,8);
            if ((int)num_2 == num_2) {
              pEVar7 = (ExpressionContext *)
                       ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)syntax_local)
              ;
              ExprIntegerLiteral::ExprIntegerLiteral
                        ((ExprIntegerLiteral *)pEVar7,(SynBase *)value,
                         *(TypeBase **)&syntax_local[0x16f].super_SynBase.listed,num_2);
              ctx_local = pEVar7;
            }
            else {
              pEVar7 = (ExpressionContext *)
                       ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)syntax_local)
              ;
              ExprIntegerLiteral::ExprIntegerLiteral
                        ((ExprIntegerLiteral *)pEVar7,(SynBase *)value,
                         (TypeBase *)syntax_local[0x16f].value.begin,num_2);
              ctx_local = pEVar7;
            }
          }
        }
      }
    }
    else {
      pIVar6 = value + 5;
      InplaceStr::InplaceStr((InplaceStr *)&num_6,"f");
      bVar3 = InplaceStr::operator==(pIVar6,(InplaceStr *)&num_6);
      if (bVar3) {
        dVar8 = anon_unknown.dwarf_8df1c::ParseDouble
                          ((ExpressionContext *)syntax_local,pIStack_28->begin);
        pEVar7 = (ExpressionContext *)
                 ExpressionContext::get<ExprRationalLiteral>((ExpressionContext *)syntax_local);
        ExprRationalLiteral::ExprRationalLiteral
                  ((ExprRationalLiteral *)pEVar7,(SynBase *)value,
                   (TypeBase *)syntax_local[0x16f].value.end,(double)(float)dVar8);
        ctx_local = pEVar7;
      }
      else {
        bVar3 = InplaceStr::empty(value + 5);
        pSVar2 = syntax_local;
        pIVar6 = value;
        if (!bVar3) {
          pcVar1 = value[5].begin;
          uVar4 = InplaceStr::length(value + 5);
          anon_unknown.dwarf_8df1c::ReportAt
                    ((ExpressionContext *)pSVar2,(SynBase *)pIVar6,pcVar1,
                     "ERROR: unknown number suffix \'%.*s\'",(ulong)uVar4,value[5].begin);
        }
        dVar8 = anon_unknown.dwarf_8df1c::ParseDouble
                          ((ExpressionContext *)syntax_local,pIStack_28->begin);
        pEVar7 = (ExpressionContext *)
                 ExpressionContext::get<ExprRationalLiteral>((ExpressionContext *)syntax_local);
        ExprRationalLiteral::ExprRationalLiteral
                  ((ExprRationalLiteral *)pEVar7,(SynBase *)value,
                   (TypeBase *)syntax_local[0x16f].suffix.begin,dVar8);
        ctx_local = pEVar7;
      }
    }
  }
  else {
    uVar4 = InplaceStr::length(pIStack_28);
    if (uVar4 == 2) {
      anon_unknown.dwarf_8df1c::ReportAt
                ((ExpressionContext *)syntax_local,(SynBase *)value,pIStack_28->begin + 2,
                 "ERROR: \'0x\' must be followed by number");
    }
    local_29 = 0;
    pIVar6 = value + 5;
    InplaceStr::InplaceStr((InplaceStr *)local_40,"l");
    bVar3 = InplaceStr::operator==(pIVar6,(InplaceStr *)local_40);
    if (bVar3) {
      local_29 = 1;
    }
    else {
      bVar3 = InplaceStr::empty(value + 5);
      pSVar2 = syntax_local;
      pIVar6 = value;
      if (!bVar3) {
        pcVar1 = value[5].begin;
        uVar4 = InplaceStr::length(value + 5);
        anon_unknown.dwarf_8df1c::ReportAt
                  ((ExpressionContext *)pSVar2,(SynBase *)pIVar6,pcVar1,
                   "ERROR: unknown number suffix \'%.*s\'",(ulong)uVar4,value[5].begin);
      }
    }
    for (num_1._4_4_ = 2; pIStack_28->begin[num_1._4_4_] == '0'; num_1._4_4_ = num_1._4_4_ + 1) {
    }
    uVar4 = InplaceStr::length(pIStack_28);
    if (0x10 < (int)(uVar4 - num_1._4_4_)) {
      anon_unknown.dwarf_8df1c::ReportAt
                ((ExpressionContext *)syntax_local,(SynBase *)value,pIStack_28->begin,
                 "ERROR: overflow in hexadecimal constant");
    }
    _i = anon_unknown.dwarf_8df1c::ParseLong
                   ((ExpressionContext *)syntax_local,(SynBase *)value,
                    pIStack_28->begin + num_1._4_4_,pIStack_28->end,0x10);
    if (((local_29 & 1) == 0) && ((long)(int)_i == _i)) {
      pEVar7 = (ExpressionContext *)
               ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)syntax_local);
      ExprIntegerLiteral::ExprIntegerLiteral
                ((ExprIntegerLiteral *)pEVar7,(SynBase *)value,
                 *(TypeBase **)&syntax_local[0x16f].super_SynBase.listed,_i);
      ctx_local = pEVar7;
    }
    else {
      pEVar7 = (ExpressionContext *)
               ExpressionContext::get<ExprIntegerLiteral>((ExpressionContext *)syntax_local);
      ExprIntegerLiteral::ExprIntegerLiteral
                ((ExprIntegerLiteral *)pEVar7,(SynBase *)value,
                 (TypeBase *)syntax_local[0x16f].value.begin,_i);
      ctx_local = pEVar7;
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeNumber(ExpressionContext &ctx, SynNumber *syntax)
{
	InplaceStr &value = syntax->value;

	// Hexadecimal
	if(value.length() > 1 && value.begin[1] == 'x')
	{
		if(value.length() == 2)
			ReportAt(ctx, syntax, value.begin + 2, "ERROR: '0x' must be followed by number");

		bool forceLong = false;

		if(syntax->suffix == InplaceStr("l"))
			forceLong = true;
		else if(!syntax->suffix.empty())
			ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);

		// Skip 0x
		unsigned pos = 2;

		// Skip leading zeros
		while(value.begin[pos] == '0')
			pos++;

		if(int(value.length() - pos) > 16)
			ReportAt(ctx, syntax, value.begin, "ERROR: overflow in hexadecimal constant");

		long long num = (long long)ParseLong(ctx, syntax, value.begin + pos, value.end, 16);

		// If number overflows integer number, create long number
		if(!forceLong && int(num) == num)
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
	}

	bool isFP = false;

	for(unsigned i = 0; i < value.length(); i++)
	{
		if(value.begin[i] == '.' || value.begin[i] == 'e')
			isFP = true;
	}

	if(!isFP)
	{
		if(syntax->suffix == InplaceStr("b"))
		{
			unsigned pos = 0;

			// Skip leading zeros
			while(value.begin[pos] == '0')
				pos++;

			if(int(value.length() - pos) > 64)
				ReportAt(ctx, syntax, value.begin, "ERROR: overflow in binary constant");

			long long num = (long long)ParseLong(ctx, syntax, value.begin + pos, value.end, 2);

			// If number overflows integer number, create long number
			if(int(num) == num)
				return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
		}
		else if(syntax->suffix == InplaceStr("l"))
		{
			unsigned long long num = ParseLong(ctx, syntax, value.begin, value.end, 10);

			if(num > 9223372036854775807ull)
				StopAt(ctx, syntax, value.begin, "ERROR: overflow in integer constant");

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, (long long)num);
		}
		else if(!syntax->suffix.empty())
		{
			ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);
		}

		if(value.length() > 1 && value.begin[0] == '0' && isDigit(value.begin[1]))
		{
			unsigned pos = 0;

			// Skip leading zeros
			while(value.begin[pos] == '0')
				pos++;

			if(int(value.length() - pos) > 22 || (int(value.length() - pos) > 21 && value.begin[pos] != '1'))
				ReportAt(ctx, syntax, value.begin, "ERROR: overflow in octal constant");

			long long num = (long long)ParseLong(ctx,syntax,  value.begin, value.end, 8);

			// If number overflows integer number, create long number
			if(int(num) == num)
				return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
		}

		long long num = (long long)ParseLong(ctx, syntax, value.begin, value.end, 10);

		if(int(num) != num)
			StopAt(ctx, syntax, value.begin, "ERROR: overflow in integer constant");

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);
	}

	if(syntax->suffix == InplaceStr("f"))
	{
		double num = ParseDouble(ctx, value.begin);

		return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(syntax, ctx.typeFloat, float(num));
	}
	else if(!syntax->suffix.empty())
	{
		ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);
	}

	double num = ParseDouble(ctx, value.begin);

	return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(syntax, ctx.typeDouble, num);
}